

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O1

void swrenderer::R_Subsector(subsector_t *sub)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  sector_t_conflict *psVar4;
  FMiniBSP *pFVar5;
  secplane_t *psVar6;
  F3DFloor *pFVar7;
  sector_t *psVar8;
  double dVar9;
  undefined1 auVar10 [16];
  DWORD lightlevel;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar14;
  FTextureID FVar15;
  unsigned_short uVar16;
  uint uVar17;
  FSectorPortal *pFVar18;
  lightlist_t *plVar19;
  extsector_t *peVar20;
  int iVar21;
  DWORD DVar22;
  long lVar23;
  DWORD DVar24;
  long lVar25;
  ulong uVar26;
  subsector_t *psVar27;
  seg_t *line;
  double dVar28;
  int ceilinglightlevel;
  int floorlightlevel;
  sector_t_conflict tempsec;
  undefined8 uStack_280;
  DWORD local_274;
  DWORD local_270;
  DWORD local_26c;
  visplane_t *local_268;
  visplane_t *local_260 [2];
  subsector_t *local_250;
  sector_t_conflict local_248;
  
  psVar27 = InSubsector;
  if ((InSubsector == (subsector_t *)0x0) &&
     (InSubsector = sub,
     (long)numsubsectors <= ((long)sub - (long)subsectors >> 4) * -0x5555555555555555)) {
    I_Error("R_Subsector: ss %ti with numss = %i");
  }
  psVar4 = sub->sector;
  if (psVar4 != (sector_t_conflict *)0x0) {
    if (sub->polys == (FPolyNode *)0x0) {
      frontsector = psVar4;
      *(byte *)&psVar4->MoreFlags = (byte)psVar4->MoreFlags | 0x80;
      frontsector = R_FakeFlat(psVar4,&local_248,(int *)&local_270,(int *)&local_274,false);
      DVar24 = local_270;
      DVar22 = local_274;
      foggy = 1;
      if ((level.fadeto == 0) && ((frontsector->ColorMap->Fade).field_0.d == 0)) {
        foggy = ((byte)level.flags & 8) >> 3;
      }
      r_actualextralight = extralight << 4;
      if (foggy != 0) {
        r_actualextralight = 0;
      }
      if (((fixedlightlev < 0) && (frontsector->e != (extsector_t *)0x0)) &&
         ((frontsector->e->XFloor).lightlist.Count != 0)) {
        plVar19 = P_GetPlaneLight(frontsector,&frontsector->ceilingplane,false);
        basecolormap = plVar19->extra_colormap;
        if (plVar19->p_lightlevel != &frontsector->lightlevel) {
          local_274 = (DWORD)*plVar19->p_lightlevel;
        }
      }
      else if ((fixedlightlev < 0) || (r_fullbrightignoresectorcolor.Value == false)) {
        basecolormap = frontsector->ColorMap;
      }
      else {
        basecolormap = &FullNormalLight;
      }
      pFVar18 = sector_t::ValidatePortal((sector_t *)frontsector,1);
      dVar9 = ViewPos.Z * (frontsector->ceilingplane).normal.Z +
              ViewPos.Y * (frontsector->ceilingplane).normal.Y +
              ViewPos.X * (frontsector->ceilingplane).normal.X + (frontsector->ceilingplane).D;
      if ((((-1.52587890625e-05 <= dVar9) && (1.52587890625e-05 < dVar9)) ||
          ((pFVar18 != (FSectorPortal *)0x0 ||
           (frontsector->planes[1].Texture.texnum == skyflatnum.texnum)))) ||
         (((psVar4 = frontsector->heightsec, psVar4 != (sector_t_conflict *)0x0 &&
           ((psVar4->MoreFlags & 0x10) == 0)) &&
          (psVar4->planes[0].Texture.texnum == skyflatnum.texnum)))) {
        ceilingplane = R_FindPlane(&frontsector->ceilingplane,
                                   (FTextureID)frontsector->planes[1].Texture.texnum,
                                   r_actualextralight + local_274,frontsector->planes[1].alpha,
                                   SUB41((frontsector->planes[1].Flags & 4U) >> 2,0),
                                   &frontsector->planes[1].xform,frontsector->sky,pFVar18);
      }
      else {
        ceilingplane = (visplane_t *)0x0;
      }
      if (((fixedlightlev < 0) && (frontsector->e != (extsector_t *)0x0)) &&
         ((frontsector->e->XFloor).lightlist.Count != 0)) {
        plVar19 = P_GetPlaneLight(frontsector,&frontsector->floorplane,false);
        basecolormap = plVar19->extra_colormap;
        if (plVar19->p_lightlevel != &frontsector->lightlevel) {
          local_270 = (DWORD)*plVar19->p_lightlevel;
        }
      }
      else if ((fixedlightlev < 0) || (r_fullbrightignoresectorcolor.Value == false)) {
        basecolormap = frontsector->ColorMap;
      }
      else {
        basecolormap = &FullNormalLight;
      }
      pFVar18 = sector_t::ValidatePortal((sector_t *)frontsector,0);
      dVar9 = ViewPos.Z * (frontsector->floorplane).normal.Z +
              ViewPos.Y * (frontsector->floorplane).normal.Y +
              ViewPos.X * (frontsector->floorplane).normal.X + (frontsector->floorplane).D;
      if (((((-1.52587890625e-05 <= dVar9) && (1.52587890625e-05 < dVar9)) ||
           (pFVar18 != (FSectorPortal *)0x0)) ||
          (frontsector->planes[0].Texture.texnum == skyflatnum.texnum)) ||
         (((psVar4 = frontsector->heightsec, psVar4 != (sector_t_conflict *)0x0 &&
           ((psVar4->MoreFlags & 0x10) == 0)) &&
          (psVar4->planes[1].Texture.texnum == skyflatnum.texnum)))) {
        floorplane = R_FindPlane(&frontsector->floorplane,
                                 (FTextureID)frontsector->planes[0].Texture.texnum,
                                 r_actualextralight + local_270,frontsector->planes[0].alpha,
                                 SUB41((frontsector->planes[0].Flags & 4U) >> 2,0),
                                 (FTransform *)frontsector,frontsector->sky,pFVar18);
      }
      else {
        floorplane = (visplane_t *)0x0;
      }
      if (((r_3dfloors.Value != 0) && (frontsector->e != (extsector_t *)0x0)) &&
         ((frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0)) {
        local_260[0] = (visplane_t *)CONCAT44(local_260[0]._4_4_,DVar22);
        local_26c = DVar24;
        local_260[1] = ceilingplane;
        peVar20 = frontsector->e;
        local_268 = floorplane;
        if (0 < (int)(peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count) {
          lVar25 = 0;
          do {
            fakeFloor = (peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[lVar25]
            ;
            if ((((fakeFloor->flags & 1) != 0) && (fakeFloor->model != (sector_t *)0x0)) &&
               (psVar6 = (fakeFloor->bottom).plane,
               (psVar6->normal).Y == 0.0 && (psVar6->normal).X == 0.0)) {
              if ((fakeFloor->flags & 0x2c) != 0x20) {
                R_3D_AddHeight((fakeFloor->top).plane,(sector_t *)frontsector);
              }
              if (((fakeFloor->flags & 8) != 0) &&
                 ((~fakeFloor->flags & 0x40400000) != 0 && (long)fakeFloor->alpha != 0)) {
                auVar10 = SEXT816((long)fakeFloor->alpha << 0x10) * ZEXT816(0x8080808080808081);
                fakeAlpha = (int)(auVar10._8_8_ >> 7) - (auVar10._12_4_ >> 0x1f);
                if (0xffff < fakeAlpha) {
                  fakeAlpha = 0x10000;
                }
                if (fakeFloor->validcount != validcount) {
                  fakeFloor->validcount = validcount;
                  R_3D_NewClip();
                }
                psVar6 = (fakeFloor->top).plane;
                dVar9 = (frontsector->centerspot).X;
                dVar3 = (frontsector->centerspot).Y;
                dVar28 = ((psVar6->normal).Y * dVar3 + (psVar6->normal).X * dVar9 + psVar6->D) *
                         psVar6->negiC;
                if ((dVar28 < ViewPos.Z) &&
                   ((dVar3 * (frontsector->floorplane).normal.Y +
                    dVar9 * (frontsector->floorplane).normal.X + (frontsector->floorplane).D) *
                    (frontsector->floorplane).negiC < dVar28)) {
                  fake3D = 1;
                  sector_t::operator=((sector_t *)&local_248,(sector_t_conflict *)fakeFloor->model);
                  FVar15.texnum = local_248.planes[0].Texture.texnum;
                  psVar6 = (fakeFloor->top).plane;
                  local_248.floorplane.normal.Z = (psVar6->normal).Z;
                  local_248.floorplane.normal.Y = (psVar6->normal).Y;
                  local_248.floorplane.normal.X = (psVar6->normal).X;
                  local_248.floorplane.D = psVar6->D;
                  local_248.floorplane.negiC = psVar6->negiC;
                  psVar6 = (fakeFloor->bottom).plane;
                  local_248.ceilingplane.normal.Z = (psVar6->normal).Z;
                  local_248.ceilingplane.normal.Y = (psVar6->normal).Y;
                  local_248.ceilingplane.normal.X = (psVar6->normal).X;
                  local_248.ceilingplane.D = psVar6->D;
                  local_248.ceilingplane.negiC = psVar6->negiC;
                  if ((fakeFloor->flags & 0x40400000) == 0) {
                    local_248.planes[0].Texture.texnum = local_248.planes[1].Texture.texnum;
                    lVar23 = 1;
                    if (FVar15.texnum != local_248.planes[1].Texture.texnum) {
                      sector_t::AdjustFloorClip((sector_t *)&local_248);
                    }
                  }
                  else {
                    lVar23 = 0;
                  }
                  frontsector = &local_248;
                  if ((fixedlightlev < 0) && ((sub->sector->e->XFloor).lightlist.Count != 0)) {
                    plVar19 = P_GetPlaneLight(sub->sector,&local_248.floorplane,false);
                    basecolormap = plVar19->extra_colormap;
                    local_270 = (DWORD)*plVar19->p_lightlevel;
                  }
                  ceilingplane = (visplane_t *)0x0;
                  floorplane = R_FindPlane(&frontsector->floorplane,
                                           (FTextureID)frontsector->planes[0].Texture.texnum,
                                           r_actualextralight + local_270,
                                           frontsector->planes[0].alpha,
                                           (bool)((byte)(fakeFloor->flags >> 0x1c) & 1),
                                           &frontsector->planes[lVar23].xform,frontsector->sky,
                                           (FSectorPortal *)0x0);
                  R_FakeDrawLoop(sub);
                  fake3D = 0;
                  frontsector = sub->sector;
                }
              }
            }
            lVar25 = lVar25 + 1;
            peVar20 = frontsector->e;
          } while (lVar25 < (int)(peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
                                 Count);
        }
        peVar20 = frontsector->e;
        if ((peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
          uVar26 = 0;
          do {
            fakeFloor = (peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar26]
            ;
            if ((((fakeFloor->flags & 1) != 0) && (fakeFloor->model != (sector_t *)0x0)) &&
               (psVar6 = (fakeFloor->top).plane,
               (psVar6->normal).Y == 0.0 && (psVar6->normal).X == 0.0)) {
              if ((fakeFloor->flags & 0x2c) != 0x20) {
                R_3D_AddHeight((fakeFloor->bottom).plane,(sector_t *)frontsector);
              }
              if (((fakeFloor->flags & 8) != 0) &&
                 ((fakeFloor->flags & 0x40400010) != 0x400010 && (long)fakeFloor->alpha != 0)) {
                auVar10 = SEXT816((long)fakeFloor->alpha << 0x10) * ZEXT816(0x8080808080808081);
                fakeAlpha = (int)(auVar10._8_8_ >> 7) - (auVar10._12_4_ >> 0x1f);
                if (0xffff < fakeAlpha) {
                  fakeAlpha = 0x10000;
                }
                if (fakeFloor->validcount != validcount) {
                  fakeFloor->validcount = validcount;
                  R_3D_NewClip();
                }
                psVar6 = (fakeFloor->bottom).plane;
                dVar9 = (frontsector->centerspot).X;
                dVar3 = (frontsector->centerspot).Y;
                dVar28 = ((psVar6->normal).Y * dVar3 + (psVar6->normal).X * dVar9 + psVar6->D) *
                         psVar6->negiC;
                if ((ViewPos.Z < dVar28) &&
                   (dVar28 < (dVar3 * (frontsector->ceilingplane).normal.Y +
                             dVar9 * (frontsector->ceilingplane).normal.X +
                             (frontsector->ceilingplane).D) * (frontsector->ceilingplane).negiC)) {
                  fake3D = 2;
                  sector_t::operator=((sector_t *)&local_248,(sector_t_conflict *)fakeFloor->model);
                  psVar6 = (fakeFloor->top).plane;
                  local_248.floorplane.normal.Z = (psVar6->normal).Z;
                  local_248.floorplane.normal.Y = (psVar6->normal).Y;
                  local_248.floorplane.normal.X = (psVar6->normal).X;
                  local_248.floorplane.D = psVar6->D;
                  local_248.floorplane.negiC = psVar6->negiC;
                  psVar6 = (fakeFloor->bottom).plane;
                  local_248.ceilingplane.normal.Z = (psVar6->normal).Z;
                  local_248.ceilingplane.normal.Y = (psVar6->normal).Y;
                  local_248.ceilingplane.normal.X = (psVar6->normal).X;
                  local_248.ceilingplane.negiC = psVar6->negiC;
                  uVar17 = fakeFloor->flags & 0x40400000;
                  if (uVar17 == 0 || uVar17 == 0x40400000) {
                    local_248.planes[1].Texture.texnum = local_248.planes[0].Texture.texnum;
                  }
                  local_248.ceilingplane.D =
                       local_248.ceilingplane.normal.Z * 1.52587890625e-05 + psVar6->D;
                  frontsector = &local_248;
                  if ((fixedlightlev < 0) && ((sub->sector->e->XFloor).lightlist.Count != 0)) {
                    plVar19 = P_GetPlaneLight(sub->sector,&local_248.ceilingplane,false);
                    basecolormap = plVar19->extra_colormap;
                    local_274 = (DWORD)*plVar19->p_lightlevel;
                  }
                  local_248.ceilingplane.D =
                       local_248.ceilingplane.normal.Z * -1.52587890625e-05 +
                       local_248.ceilingplane.D;
                  floorplane = (visplane_t *)0x0;
                  ceilingplane = R_FindPlane(&frontsector->ceilingplane,
                                             (FTextureID)frontsector->planes[1].Texture.texnum,
                                             r_actualextralight + local_274,
                                             frontsector->planes[1].alpha,
                                             (bool)((byte)(fakeFloor->flags >> 0x1c) & 1),
                                             &frontsector->planes
                                              [uVar17 != 0 && uVar17 != 0x40400000].xform,
                                             frontsector->sky,(FSectorPortal *)0x0);
                  R_FakeDrawLoop(sub);
                  fake3D = 0;
                  frontsector = sub->sector;
                }
              }
            }
            uVar26 = uVar26 + 1;
            peVar20 = frontsector->e;
          } while (uVar26 < (peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count);
        }
        fakeFloor = (F3DFloor *)0x0;
        floorplane = local_268;
        ceilingplane = local_260[1];
        DVar22 = (DWORD)local_260[0];
        DVar24 = local_26c;
      }
      basecolormap = frontsector->ColorMap;
      lightlevel = DVar24;
      if (frontsector->planes[1].Texture.texnum == skyflatnum.texnum) {
        lightlevel = DVar22;
      }
      local_274 = DVar22;
      local_270 = DVar24;
      R_AddSprites(sub->sector,lightlevel,(uint)FakeSide);
      uVar26 = ((long)sub - (long)subsectors >> 4) * -0x5555555555555555;
      if (((uint)uVar26 < (uint)numsubsectors) &&
         (uVar16 = ParticlesInSubsec.Array[uVar26 & 0xffffffff], uVar16 != 0xffff)) {
        iVar21 = ((local_274 + local_270) - ((int)(local_274 + local_270) >> 0x1f) >> 1) +
                 r_actualextralight;
        do {
          R_ProjectParticle(Particles + uVar16,sub->sector,iVar21 * -0x4000 + 0x3d0000,
                            (uint)FakeSide);
          uVar16 = Particles[uVar16].snext;
        } while (uVar16 != 0xffff);
      }
      DVar22 = sub->numlines;
      if (DVar22 != 0) {
        line = sub->firstline;
        local_250 = psVar27;
        do {
          if (((psVar27 != (subsector_t *)0x0) || (line->sidedef == (side_t *)0x0)) ||
             ((line->sidedef->Flags & 0x40) == 0)) {
            if (((r_3dfloors.Value != 0) && (line->backsector != (sector_t_conflict *)0x0)) &&
               ((frontsector->e != (extsector_t *)0x0 &&
                ((line->backsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count !=
                 0)))) {
              local_260[0] = floorplane;
              local_268 = ceilingplane;
              floorplane = (visplane_t *)0x0;
              ceilingplane = (visplane_t *)0x0;
              peVar20 = line->backsector->e;
              if ((peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
                uVar26 = 0;
                local_26c = DVar22;
                do {
                  pFVar7 = (peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array
                           [uVar26];
                  if (((~pFVar7->flags & 9) == 0) &&
                     (psVar8 = pFVar7->model, psVar8 != (sector_t *)0x0)) {
                    fake3D = 4;
                    lVar25 = 0x38;
                    do {
                      *(undefined8 *)((long)local_260 + lVar25) =
                           *(undefined8 *)((long)psVar8->planes + lVar25 + -0x18);
                      puVar1 = (undefined8 *)((long)psVar8->planes + lVar25 + -0x38);
                      uVar11 = *puVar1;
                      uVar12 = puVar1[1];
                      puVar1 = (undefined8 *)((long)psVar8->planes + lVar25 + -0x28);
                      uVar13 = puVar1[1];
                      *(undefined8 *)((long)&local_270 + lVar25) = *puVar1;
                      *(undefined8 *)((long)&local_268 + lVar25) = uVar13;
                      *(undefined8 *)((long)&uStack_280 + lVar25) = uVar11;
                      *(undefined8 *)(&stack0xfffffffffffffd88 + lVar25) = uVar12;
                      *(undefined8 *)((long)local_260 + lVar25 + 8) =
                           *(undefined8 *)((long)psVar8->planes + lVar25 + -0x10);
                      *(undefined8 *)((long)local_248.planes + lVar25 + -8) =
                           *(undefined8 *)((long)psVar8->planes + lVar25 + -8);
                      puVar2 = (undefined8 *)((long)&psVar8->planes[0].xform.xOffs + lVar25);
                      uVar11 = puVar2[1];
                      puVar1 = (undefined8 *)((long)&psVar8->planes[0].xform.baseyOffs + lVar25);
                      uVar12 = *puVar1;
                      uVar13 = puVar1[1];
                      *(undefined8 *)((long)&local_248.planes[0].xform.xOffs + lVar25) = *puVar2;
                      *(undefined8 *)((long)&local_248.planes[0].xform.yOffs + lVar25) = uVar11;
                      *(undefined8 *)((long)&local_248.planes[0].xform.baseyOffs + lVar25) = uVar12;
                      *(undefined8 *)((long)&local_248.planes[0].xform.xScale + lVar25) = uVar13;
                      lVar25 = lVar25 + 0x58;
                    } while (lVar25 != 0xe8);
                    local_248.floorplane.normal.Z = (psVar8->floorplane).normal.Z;
                    local_248.floorplane.normal.Y = (psVar8->floorplane).normal.Y;
                    local_248.floorplane.normal.X = (psVar8->floorplane).normal.X;
                    local_248.floorplane.D = (psVar8->floorplane).D;
                    local_248.floorplane.negiC = (psVar8->floorplane).negiC;
                    local_248.ceilingplane.normal.Z = (psVar8->ceilingplane).normal.Z;
                    local_248.ceilingplane.normal.Y = (psVar8->ceilingplane).normal.Y;
                    local_248.ceilingplane.normal.X = (psVar8->ceilingplane).normal.X;
                    local_248.ceilingplane.D = (psVar8->ceilingplane).D;
                    local_248.ceilingplane.negiC = (psVar8->ceilingplane).negiC;
                    local_248.ColorMap = psVar8->ColorMap;
                    aVar14 = (psVar8->SoundTarget).field_0;
                    local_248.seqType = psVar8->seqType;
                    local_248._278_2_ = *(undefined2 *)&psVar8->field_0x116;
                    local_248.sky = psVar8->sky;
                    local_248._272_4_ =
                         SUB84((ulong)*(undefined8 *)((long)&(psVar8->SoundTarget).field_0 + 4) >>
                               0x20,0);
                    local_248.SoundTarget.field_0._0_4_ = aVar14._0_4_;
                    local_248.SoundTarget.field_0._4_4_ = aVar14._4_4_;
                    local_248.SeqName.super_FName.Index = (FName)(psVar8->SeqName).super_FName.Index
                    ;
                    local_248.centerspot.Y = (psVar8->centerspot).Y;
                    local_248.centerspot.X = (psVar8->centerspot).X;
                    fakeFloor = pFVar7;
                    memcpy(&local_248.validcount,&psVar8->validcount,0xb0);
                    local_248.damagetype.super_FName.Index =
                         (FName)(psVar8->damagetype).super_FName.Index;
                    local_248.e._4_4_ = *(undefined4 *)((long)&psVar8->e + 4);
                    local_248.damageamount = psVar8->damageamount;
                    local_248.damageinterval = psVar8->damageinterval;
                    local_248.leakydamage = psVar8->leakydamage;
                    local_248.ZoneNumber = psVar8->ZoneNumber;
                    local_248.MoreFlags = psVar8->MoreFlags;
                    local_248.Flags = psVar8->Flags;
                    local_248._500_8_ = *(undefined8 *)&psVar8->field_0x1f4;
                    local_248._508_8_ = *(undefined8 *)((long)&(psVar8->SecActTarget).field_0 + 4);
                    local_248._516_8_ = *(undefined8 *)(psVar8->Portals + 1);
                    local_248._524_8_ = *(undefined8 *)&psVar8->sectornum;
                    psVar6 = (pFVar7->top).plane;
                    local_248.floorplane.normal.Z = (psVar6->normal).Z;
                    local_248.floorplane.normal.Y = (psVar6->normal).Y;
                    local_248.floorplane.normal.X = (psVar6->normal).X;
                    local_248.floorplane.D = psVar6->D;
                    local_248.floorplane.negiC = psVar6->negiC;
                    psVar6 = (pFVar7->bottom).plane;
                    local_248.ceilingplane.normal.Z = (psVar6->normal).Z;
                    local_248.ceilingplane.normal.Y = (psVar6->normal).Y;
                    local_248.ceilingplane.normal.X = (psVar6->normal).X;
                    local_248.ceilingplane.D = psVar6->D;
                    local_248.ceilingplane.negiC = psVar6->negiC;
                    backsector = &local_248;
                    if (pFVar7->validcount != validcount) {
                      pFVar7->validcount = validcount;
                      R_3D_NewClip();
                    }
                    R_AddLine(line);
                    DVar22 = local_26c;
                  }
                  uVar26 = uVar26 + 1;
                  peVar20 = line->backsector->e;
                } while (uVar26 < (peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
                                  Count);
              }
              fakeFloor = (F3DFloor *)0x0;
              fake3D = 0;
              floorplane = local_260[0];
              ceilingplane = local_268;
              psVar27 = local_250;
            }
            R_AddLine(line);
          }
          DVar22 = DVar22 - 1;
          line = line + 1;
        } while (DVar22 != 0);
      }
    }
    else {
      if ((sub->BSP == (FMiniBSP *)0x0) || (sub->BSP->bDirty == true)) {
        subsector_t::BuildPolyBSP(sub);
      }
      pFVar5 = sub->BSP;
      uVar17 = (pFVar5->Nodes).Count;
      if (uVar17 == 0) {
        R_Subsector((pFVar5->Subsectors).Array);
      }
      else {
        R_RenderBSPNode((pFVar5->Nodes).Array + (uVar17 - 1));
      }
    }
    if (psVar27 == (subsector_t *)0x0) {
      InSubsector = (subsector_t *)0x0;
    }
    return;
  }
  __assert_fail("sub->sector != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_bsp.cpp"
                ,0x42d,"void swrenderer::R_Subsector(subsector_t *)");
}

Assistant:

void R_Subsector (subsector_t *sub)
{
	int 		 count;
	seg_t*		 line;
	sector_t     tempsec;				// killough 3/7/98: deep water hack
	int          floorlightlevel;		// killough 3/16/98: set floor lightlevel
	int          ceilinglightlevel;		// killough 4/11/98
	bool		 outersubsector;
	int	fll, cll, position;
	FSectorPortal *portal;

	// kg3D - fake floor stuff
	visplane_t *backupfp;
	visplane_t *backupcp;
	//secplane_t templane;
	lightlist_t *light;

	if (InSubsector != NULL)
	{ // InSubsector is not NULL. This means we are rendering from a mini-BSP.
		outersubsector = false;
	}
	else
	{
		outersubsector = true;
		InSubsector = sub;
	}

#ifdef RANGECHECK
	if (outersubsector && sub - subsectors >= (ptrdiff_t)numsubsectors)
		I_Error ("R_Subsector: ss %ti with numss = %i", sub - subsectors, numsubsectors);
#endif

	assert(sub->sector != NULL);

	if (sub->polys)
	{ // Render the polyobjs in the subsector first
		R_AddPolyobjs(sub);
		if (outersubsector)
		{
			InSubsector = NULL;
		}
		return;
	}

	frontsector = sub->sector;
	frontsector->MoreFlags |= SECF_DRAWN;
	count = sub->numlines;
	line = sub->firstline;

	// killough 3/8/98, 4/4/98: Deep water / fake ceiling effect
	frontsector = R_FakeFlat(frontsector, &tempsec, &floorlightlevel,
						   &ceilinglightlevel, false);	// killough 4/11/98

	fll = floorlightlevel;
	cll = ceilinglightlevel;

	// [RH] set foggy flag
	foggy = level.fadeto || frontsector->ColorMap->Fade || (level.flags & LEVEL_HASFADETABLE);
	r_actualextralight = foggy ? 0 : extralight << 4;

	// kg3D - fake lights
	if (fixedlightlev < 0 && frontsector->e && frontsector->e->XFloor.lightlist.Size())
	{
		light = P_GetPlaneLight(frontsector, &frontsector->ceilingplane, false);
		basecolormap = light->extra_colormap;
		// If this is the real ceiling, don't discard plane lighting R_FakeFlat()
		// accounted for.
		if (light->p_lightlevel != &frontsector->lightlevel)
		{
			ceilinglightlevel = *light->p_lightlevel;
		}
	}
	else
	{
		basecolormap = (r_fullbrightignoresectorcolor && fixedlightlev >= 0) ? &FullNormalLight : frontsector->ColorMap;
	}

	portal = frontsector->ValidatePortal(sector_t::ceiling);

	ceilingplane = frontsector->ceilingplane.PointOnSide(ViewPos) > 0 ||
		frontsector->GetTexture(sector_t::ceiling) == skyflatnum ||
		portal != NULL ||
		(frontsector->heightsec && 
		 !(frontsector->heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC) &&
		 frontsector->heightsec->GetTexture(sector_t::floor) == skyflatnum) ?
		R_FindPlane(frontsector->ceilingplane,		// killough 3/8/98
					frontsector->GetTexture(sector_t::ceiling),
					ceilinglightlevel + r_actualextralight,				// killough 4/11/98
					frontsector->GetAlpha(sector_t::ceiling),
					!!(frontsector->GetFlags(sector_t::ceiling) & PLANEF_ADDITIVE),
					frontsector->planes[sector_t::ceiling].xform,
					frontsector->sky,
					portal
					) : NULL;

	if (fixedlightlev < 0 && frontsector->e && frontsector->e->XFloor.lightlist.Size())
	{
		light = P_GetPlaneLight(frontsector, &frontsector->floorplane, false);
		basecolormap = light->extra_colormap;
		// If this is the real floor, don't discard plane lighting R_FakeFlat()
		// accounted for.
		if (light->p_lightlevel != &frontsector->lightlevel)
		{
			floorlightlevel = *light->p_lightlevel;
		}
	}
	else
	{
		basecolormap = (r_fullbrightignoresectorcolor && fixedlightlev >= 0) ? &FullNormalLight : frontsector->ColorMap;
	}

	// killough 3/7/98: Add (x,y) offsets to flats, add deep water check
	// killough 3/16/98: add floorlightlevel
	// killough 10/98: add support for skies transferred from sidedefs
	portal = frontsector->ValidatePortal(sector_t::floor);

	floorplane = frontsector->floorplane.PointOnSide(ViewPos) > 0 || // killough 3/7/98
		frontsector->GetTexture(sector_t::floor) == skyflatnum ||
		portal != NULL ||
		(frontsector->heightsec &&
		 !(frontsector->heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC) &&
		 frontsector->heightsec->GetTexture(sector_t::ceiling) == skyflatnum) ?
		R_FindPlane(frontsector->floorplane,
					frontsector->GetTexture(sector_t::floor),
					floorlightlevel + r_actualextralight,				// killough 3/16/98
					frontsector->GetAlpha(sector_t::floor),
					!!(frontsector->GetFlags(sector_t::floor) & PLANEF_ADDITIVE),
					frontsector->planes[sector_t::floor].xform,
					frontsector->sky,
					portal
					) : NULL;

	// kg3D - fake planes rendering
	if (r_3dfloors && frontsector->e && frontsector->e->XFloor.ffloors.Size())
	{
		backupfp = floorplane;
		backupcp = ceilingplane;
		// first check all floors
		for (int i = 0; i < (int)frontsector->e->XFloor.ffloors.Size(); i++)
		{
			fakeFloor = frontsector->e->XFloor.ffloors[i];
			if (!(fakeFloor->flags & FF_EXISTS)) continue;
			if (!fakeFloor->model) continue;
			if (fakeFloor->bottom.plane->isSlope()) continue;
			if (!(fakeFloor->flags & FF_NOSHADE) || (fakeFloor->flags & (FF_RENDERPLANES|FF_RENDERSIDES)))
			{
				R_3D_AddHeight(fakeFloor->top.plane, frontsector);
			}
			if (!(fakeFloor->flags & FF_RENDERPLANES)) continue;
			if (fakeFloor->alpha == 0) continue;
			if (fakeFloor->flags & FF_THISINSIDE && fakeFloor->flags & FF_INVERTSECTOR) continue;
			fakeAlpha = MIN<fixed_t>(Scale(fakeFloor->alpha, OPAQUE, 255), OPAQUE);
			if (fakeFloor->validcount != validcount)
			{
				fakeFloor->validcount = validcount;
				R_3D_NewClip();
			}
			double fakeHeight = fakeFloor->top.plane->ZatPoint(frontsector->centerspot);
			if (fakeHeight < ViewPos.Z &&
				fakeHeight > frontsector->floorplane.ZatPoint(frontsector->centerspot))
			{
				fake3D = FAKE3D_FAKEFLOOR;
				tempsec = *fakeFloor->model;
				tempsec.floorplane = *fakeFloor->top.plane;
				tempsec.ceilingplane = *fakeFloor->bottom.plane;
				if (!(fakeFloor->flags & FF_THISINSIDE) && !(fakeFloor->flags & FF_INVERTSECTOR))
				{
					tempsec.SetTexture(sector_t::floor, tempsec.GetTexture(sector_t::ceiling));
					position = sector_t::ceiling;
				} else position = sector_t::floor;
				frontsector = &tempsec;

				if (fixedlightlev < 0 && sub->sector->e->XFloor.lightlist.Size())
				{
					light = P_GetPlaneLight(sub->sector, &frontsector->floorplane, false);
					basecolormap = light->extra_colormap;
					floorlightlevel = *light->p_lightlevel;
				}

				ceilingplane = NULL;
				floorplane = R_FindPlane(frontsector->floorplane,
					frontsector->GetTexture(sector_t::floor),
					floorlightlevel + r_actualextralight,				// killough 3/16/98
					frontsector->GetAlpha(sector_t::floor),
					!!(fakeFloor->flags & FF_ADDITIVETRANS),
					frontsector->planes[position].xform,
					frontsector->sky,
					NULL);

				R_FakeDrawLoop(sub);
				fake3D = 0;
				frontsector = sub->sector;
			}
		}
		// and now ceilings
		for (unsigned int i = 0; i < frontsector->e->XFloor.ffloors.Size(); i++)
		{
			fakeFloor = frontsector->e->XFloor.ffloors[i];
			if (!(fakeFloor->flags & FF_EXISTS)) continue;
			if (!fakeFloor->model) continue;
			if (fakeFloor->top.plane->isSlope()) continue;
			if (!(fakeFloor->flags & FF_NOSHADE) || (fakeFloor->flags & (FF_RENDERPLANES|FF_RENDERSIDES)))
			{
				R_3D_AddHeight(fakeFloor->bottom.plane, frontsector);
			}
			if (!(fakeFloor->flags & FF_RENDERPLANES)) continue;
			if (fakeFloor->alpha == 0) continue;
			if (!(fakeFloor->flags & FF_THISINSIDE) && (fakeFloor->flags & (FF_SWIMMABLE|FF_INVERTSECTOR)) == (FF_SWIMMABLE|FF_INVERTSECTOR)) continue;
			fakeAlpha = MIN<fixed_t>(Scale(fakeFloor->alpha, OPAQUE, 255), OPAQUE);

			if (fakeFloor->validcount != validcount)
			{
				fakeFloor->validcount = validcount;
				R_3D_NewClip();
			}
			double fakeHeight = fakeFloor->bottom.plane->ZatPoint(frontsector->centerspot);
			if (fakeHeight > ViewPos.Z &&
				fakeHeight < frontsector->ceilingplane.ZatPoint(frontsector->centerspot))
			{
				fake3D = FAKE3D_FAKECEILING;
				tempsec = *fakeFloor->model;
				tempsec.floorplane = *fakeFloor->top.plane;
				tempsec.ceilingplane = *fakeFloor->bottom.plane;
				if ((!(fakeFloor->flags & FF_THISINSIDE) && !(fakeFloor->flags & FF_INVERTSECTOR)) ||
					(fakeFloor->flags & FF_THISINSIDE && fakeFloor->flags & FF_INVERTSECTOR))
				{
					tempsec.SetTexture(sector_t::ceiling, tempsec.GetTexture(sector_t::floor));
					position = sector_t::floor;
				} else position = sector_t::ceiling;
				frontsector = &tempsec;

				tempsec.ceilingplane.ChangeHeight(-1 / 65536.);
				if (fixedlightlev < 0 && sub->sector->e->XFloor.lightlist.Size())
				{
					light = P_GetPlaneLight(sub->sector, &frontsector->ceilingplane, false);
					basecolormap = light->extra_colormap;
					ceilinglightlevel = *light->p_lightlevel;
				}
				tempsec.ceilingplane.ChangeHeight(1 / 65536.);

				floorplane = NULL;
				ceilingplane = R_FindPlane(frontsector->ceilingplane,		// killough 3/8/98
					frontsector->GetTexture(sector_t::ceiling),
					ceilinglightlevel + r_actualextralight,				// killough 4/11/98
					frontsector->GetAlpha(sector_t::ceiling),
					!!(fakeFloor->flags & FF_ADDITIVETRANS),
					frontsector->planes[position].xform,
					frontsector->sky,
					NULL);

				R_FakeDrawLoop(sub);
				fake3D = 0;
				frontsector = sub->sector;
			}
		}
		fakeFloor = NULL;
		floorplane = backupfp;
		ceilingplane = backupcp;
	}

	basecolormap = frontsector->ColorMap;
	floorlightlevel = fll;
	ceilinglightlevel = cll;

	// killough 9/18/98: Fix underwater slowdown, by passing real sector 
	// instead of fake one. Improve sprite lighting by basing sprite
	// lightlevels on floor & ceiling lightlevels in the surrounding area.
	// [RH] Handle sprite lighting like Duke 3D: If the ceiling is a sky, sprites are lit by
	// it, otherwise they are lit by the floor.
	R_AddSprites (sub->sector, frontsector->GetTexture(sector_t::ceiling) == skyflatnum ?
		ceilinglightlevel : floorlightlevel, FakeSide);

	// [RH] Add particles
	if ((unsigned int)(sub - subsectors) < (unsigned int)numsubsectors)
	{ // Only do it for the main BSP.
		int shade = LIGHT2SHADE((floorlightlevel + ceilinglightlevel)/2 + r_actualextralight);
		for (WORD i = ParticlesInSubsec[(unsigned int)(sub-subsectors)]; i != NO_PARTICLE; i = Particles[i].snext)
		{
			R_ProjectParticle (Particles + i, subsectors[sub-subsectors].sector, shade, FakeSide);
		}
	}

	count = sub->numlines;
	line = sub->firstline;

	while (count--)
	{
		if (!outersubsector || line->sidedef == NULL || !(line->sidedef->Flags & WALLF_POLYOBJ))
		{
			// kg3D - fake planes bounding calculation
			if (r_3dfloors && line->backsector && frontsector->e && line->backsector->e->XFloor.ffloors.Size())
			{
				backupfp = floorplane;
				backupcp = ceilingplane;
				floorplane = NULL;
				ceilingplane = NULL;
				for (unsigned int i = 0; i < line->backsector->e->XFloor.ffloors.Size(); i++)
				{
					fakeFloor = line->backsector->e->XFloor.ffloors[i];
					if (!(fakeFloor->flags & FF_EXISTS)) continue;
					if (!(fakeFloor->flags & FF_RENDERPLANES)) continue;
					if (!fakeFloor->model) continue;
					fake3D = FAKE3D_FAKEBACK;
					tempsec = *fakeFloor->model;
					tempsec.floorplane = *fakeFloor->top.plane;
					tempsec.ceilingplane = *fakeFloor->bottom.plane;
					backsector = &tempsec;
					if (fakeFloor->validcount != validcount)
					{
						fakeFloor->validcount = validcount;
						R_3D_NewClip();
					}
					R_AddLine(line); // fake
				}
				fakeFloor = NULL;
				fake3D = 0;
				floorplane = backupfp;
				ceilingplane = backupcp;
			}
			R_AddLine (line); // now real
		}
		line++;
	}
	if (outersubsector)
	{
		InSubsector = NULL;
	}
}